

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Lit_t __thiscall Potassco::SmodelsConvert::get(SmodelsConvert *this,Lit_t in)

{
  Lit_t LVar1;
  undefined8 in_RDI;
  SmData *unaff_retaddr;
  
  LVar1 = SmData::mapLit(unaff_retaddr,(Lit_t)((ulong)in_RDI >> 0x20));
  return LVar1;
}

Assistant:

Lit_t SmodelsConvert::get(Lit_t in) const {
	return data_->mapLit(in);
}